

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_graph.cpp
# Opt level: O0

void __thiscall test_adjacency_graph_at_Test::TestBody(test_adjacency_graph_at_Test *this)

{
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph;
  bool bVar1;
  int iVar2;
  reference peVar4;
  char *pcVar5;
  uint uVar3;
  char *regex;
  char *regex_00;
  span<unsigned_long,_18446744073709551615UL> sVar6;
  span<unsigned_long,_18446744073709551615UL> sVar7;
  AssertHelper local_3c0;
  Message local_3b8 [6];
  exception *gtest_exception_1;
  pointer local_380;
  span<unsigned_long,_18446744073709551615UL> test_1;
  ReturnSentinel gtest_sentinel_1;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_1;
  pointer local_348;
  DeathTest *gtest_dt_1;
  Message local_338;
  int local_32c;
  exception *gtest_exception;
  pointer local_2f8;
  span<unsigned_long,_18446744073709551615UL> test_0;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_2c0;
  DeathTest *gtest_dt;
  Message local_2b0;
  int local_2a4;
  size_t local_2a0;
  span<unsigned_long,_18446744073709551615UL> local_298;
  undefined1 local_288 [8];
  AssertionResult gtest_ar_7;
  Message local_270;
  int local_264;
  size_t local_260;
  span<unsigned_long,_18446744073709551615UL> local_258;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_6;
  Message local_230;
  int local_224;
  size_t local_220;
  span<unsigned_long,_18446744073709551615UL> local_218;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_5;
  Message local_1f0;
  int local_1e4;
  size_t local_1e0;
  span<unsigned_long,_18446744073709551615UL> local_1d8;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_4;
  Message local_1b0;
  int local_1a4;
  size_t local_1a0;
  span<unsigned_long,_18446744073709551615UL> local_198;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_3;
  Message local_170;
  int local_164;
  size_t local_160;
  span<unsigned_long,_18446744073709551615UL> local_158;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_2;
  Message local_130;
  int local_124;
  size_t local_120;
  span<unsigned_long,_18446744073709551615UL> local_118;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  Message local_f0;
  int local_e8 [4];
  size_t local_d8;
  span<unsigned_long,_18446744073709551615UL> local_d0;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar;
  int local_a8 [6];
  pair<unsigned_long,_unsigned_long> local_90;
  pair<unsigned_long,_unsigned_long> local_80;
  pair<unsigned_long,_unsigned_long> local_70;
  pair<unsigned_long,_unsigned_long> local_60;
  pair<unsigned_long,_unsigned_long> *local_50;
  undefined8 local_48;
  Adjacency_Graph<false> local_40 [8];
  Adjacency_Graph<true> graph;
  test_adjacency_graph_at_Test *this_local;
  
  local_a8[5] = 0;
  local_a8[4] = 1;
  graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_90,local_a8 + 5,local_a8 + 4)
  ;
  local_a8[3] = 2;
  local_a8[2] = 1;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_80,local_a8 + 3,local_a8 + 2)
  ;
  local_a8[1] = 2;
  local_a8[0] = 3;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_70,local_a8 + 1,local_a8);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 3;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>
            (&local_60,
             (int *)((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 4),(int *)&gtest_ar.message_);
  local_48 = 4;
  edge_graph._M_len = 4;
  edge_graph._M_array = &local_90;
  local_50 = &local_90;
  Disa::Adjacency_Graph<false>::Adjacency_Graph(local_40,edge_graph);
  local_d8 = 0;
  local_d0 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_d8);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_d0,0);
  local_e8[0] = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_c0,"graph[0][0]","1",peVar4,local_e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x5a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_120 = 0;
  local_118 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_120);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_118,1);
  local_124 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_108,"graph[0][1]","3",peVar4,&local_124);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x5b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  local_160 = 1;
  local_158 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_160);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_158,0);
  local_164 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_148,"graph[1][0]","0",peVar4,&local_164);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x5c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  local_1a0 = 1;
  local_198 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_1a0);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_198,1);
  local_1a4 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_188,"graph[1][1]","2",peVar4,&local_1a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x5d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  local_1e0 = 2;
  local_1d8 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_1e0);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_1d8,0);
  local_1e4 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_1c8,"graph[2][0]","1",peVar4,&local_1e4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x5e,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  local_220 = 2;
  local_218 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_220);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_218,1);
  local_224 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_208,"graph[2][1]","3",peVar4,&local_224);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x5f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  local_260 = 3;
  local_258 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_260);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_258,0);
  local_264 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_248,"graph[3][0]","0",peVar4,&local_264);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x60,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  local_2a0 = 3;
  local_298 = Disa::Adjacency_Graph<false>::operator[](local_40,&local_2a0);
  peVar4 = std::span<unsigned_long,_18446744073709551615UL>::operator[](&local_298,1);
  local_2a4 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_288,"graph[3][1]","2",peVar4,&local_2a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x61,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)"./*",regex);
    bVar1 = testing::internal::DeathTest::Create
                      ("auto test_0 = graph[-1]",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
                       ,99,&local_2c0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0011520d;
    if (local_2c0 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_2c0);
      iVar2 = (*local_2c0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_2c0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_2c0->_vptr_DeathTest[4])(local_2c0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_001151cf;
        local_32c = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&test_0._M_extent,local_2c0);
          bVar1 = testing::internal::AlwaysTrue();
          sVar6._M_extent._M_extent_value = (size_t)test_0._M_ptr;
          sVar6._M_ptr = local_2f8;
          if (bVar1) {
            gtest_exception = (exception *)0xffffffffffffffff;
            sVar6 = Disa::Adjacency_Graph<false>::operator[](local_40,(size_t *)&gtest_exception);
          }
          test_0._M_ptr = (pointer)sVar6._M_extent._M_extent_value;
          local_2f8 = sVar6._M_ptr;
          (*local_2c0->_vptr_DeathTest[5])(local_2c0,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&test_0._M_extent);
        }
LAB_001151cf:
        local_32c = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_32c != 0) goto LAB_0011520d;
    }
  }
  else {
LAB_0011520d:
    testing::Message::Message(&local_338);
    pcVar5 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,99,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_1,&local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_1);
    testing::Message::~Message(&local_338);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1,(internal *)"./*",regex_00);
    bVar1 = testing::internal::DeathTest::Create
                      ("auto test_1 = graph[4]",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_1,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
                       ,100,&local_348);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_348 == (pointer)0x0) goto LAB_00115763;
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_1,local_348);
      iVar2 = (*local_348->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_348->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_348->_vptr_DeathTest[4])(local_348,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00115674;
        local_32c = 4;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&test_1._M_extent,local_348);
          bVar1 = testing::internal::AlwaysTrue();
          sVar7._M_extent._M_extent_value = (size_t)test_1._M_ptr;
          sVar7._M_ptr = local_380;
          if (bVar1) {
            gtest_exception_1 = (exception *)0x4;
            sVar7 = Disa::Adjacency_Graph<false>::operator[](local_40,(size_t *)&gtest_exception_1);
          }
          test_1._M_ptr = (pointer)sVar7._M_extent._M_extent_value;
          local_380 = sVar7._M_ptr;
          (*local_348->_vptr_DeathTest[5])(local_348,2);
          local_32c = 5;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&test_1._M_extent);
        }
LAB_00115674:
        local_32c = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_1);
      if (local_32c == 0) goto LAB_00115763;
    }
  }
  testing::Message::Message(local_3b8);
  pcVar5 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_3c0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
             ,100,pcVar5);
  testing::internal::AssertHelper::operator=(&local_3c0,local_3b8);
  testing::internal::AssertHelper::~AssertHelper(&local_3c0);
  testing::Message::~Message(local_3b8);
LAB_00115763:
  Disa::Adjacency_Graph<false>::~Adjacency_Graph(local_40);
  return;
}

Assistant:

TEST(test_adjacency_graph, at) {
  Adjacency_Graph<false> graph({{0, 1}, {2, 1}, {2, 3}, {3, 0}});  // place some edge backwards.

  EXPECT_EQ(graph[0][0], 1);
  EXPECT_EQ(graph[0][1], 3);
  EXPECT_EQ(graph[1][0], 0);
  EXPECT_EQ(graph[1][1], 2);
  EXPECT_EQ(graph[2][0], 1);
  EXPECT_EQ(graph[2][1], 3);
  EXPECT_EQ(graph[3][0], 0);
  EXPECT_EQ(graph[3][1], 2);

  EXPECT_DEATH(auto test_0 = graph[-1], "./*");
  EXPECT_DEATH(auto test_1 = graph[4], "./*");
}